

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

parser_results * __thiscall
argagg::parser::parse(parser_results *__return_storage_ptr__,parser *this,int argc,char **argv)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  reference __x;
  char *pcVar4;
  ostream *poVar5;
  unexpected_option_error *puVar6;
  unexpected_argument_error *this_00;
  reference pvVar7;
  domain_error *this_01;
  definition *this_02;
  long lVar8;
  option_lacks_argument_error *this_03;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_option_results>_&&>::value,_pair<iterator,_bool>_>
  _Var9;
  byte local_1272;
  string local_1238 [32];
  undefined1 local_1218 [8];
  ostringstream msg_4;
  value_type vStack_1098;
  bool is_last_short_flag_in_group;
  option_result opt_result_1;
  mapped_type *opt_results_2;
  definition *defn_2;
  string local_1078 [32];
  undefined1 local_1058 [8];
  ostringstream msg_3;
  string local_ed8 [32];
  undefined1 local_eb8 [8];
  ostringstream msg_2;
  ulong uStack_d38;
  char short_flag;
  size_t sf_idx;
  value_type vStack_d28;
  bool there_is_an_equal_delimited_arg;
  option_result opt_result;
  mapped_type *opt_results_1;
  string local_d10 [32];
  undefined1 local_cf0 [8];
  ostringstream msg_1;
  definition *defn_1;
  string local_b68 [32];
  undefined1 local_b48 [8];
  ostringstream msg;
  string local_9c8 [8];
  string long_flag_str;
  ulong local_9a8;
  size_t flag_len;
  char *long_flag_arg;
  bool is_long_flag;
  bool treat_as_positional_argument;
  size_t arg_i_len;
  char *arg_i_cstr;
  char **arg_end;
  char **arg_i;
  reference pvStack_968;
  uint num_option_args_to_consume;
  option_result *last_option_expecting_args;
  char *last_flag_expecting_args;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_true>
  _Stack_950;
  bool ignore_flags;
  undefined1 local_948;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
  local_930;
  undefined1 auStack_8f8 [8];
  option_results opt_results;
  definition *defn;
  const_iterator __end1;
  const_iterator __begin1;
  vector<argagg::definition,_std::allocator<argagg::definition>_> *__range1;
  undefined1 local_8b0 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> pos;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
  options;
  parser_map map;
  char **argv_local;
  int argc_local;
  parser *this_local;
  parser_results *results;
  
  validate_definitions((parser_map *)&options._M_h._M_single_bucket,&this->definitions);
  memset(&pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
                   *)&pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_8b0);
  __return_storage_ptr__->program = *argv;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
  ::unordered_map(&__return_storage_ptr__->options,
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
                   *)&pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&__return_storage_ptr__->pos,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_8b0);
  __end1 = std::vector<argagg::definition,_std::allocator<argagg::definition>_>::begin
                     (&this->definitions);
  defn = (definition *)
         std::vector<argagg::definition,_std::allocator<argagg::definition>_>::end
                   (&this->definitions);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
                                     *)&defn), bVar2) {
    __x = __gnu_cxx::
          __normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
          ::operator*(&__end1);
    auStack_8f8 = (undefined1  [8])0x0;
    opt_results.all.
    super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    opt_results.all.
    super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::vector
              ((vector<argagg::option_result,_std::allocator<argagg::option_result>_> *)auStack_8f8)
    ;
    std::make_pair<std::__cxx11::string_const&,argagg::option_results&>
              (&local_930,&__x->name,(option_results *)auStack_8f8);
    _Var9 = std::
            unordered_map<std::__cxx11::string,argagg::option_results,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,argagg::option_results>>>
            ::insert<std::pair<std::__cxx11::string,argagg::option_results>>
                      ((unordered_map<std::__cxx11::string,argagg::option_results,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,argagg::option_results>>>
                        *)&__return_storage_ptr__->options,&local_930);
    _Stack_950._M_cur =
         (__node_type *)
         _Var9.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_true>
         ._M_cur;
    local_948 = _Var9.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
    ::~pair(&local_930);
    option_results::~option_results((option_results *)auStack_8f8);
    __gnu_cxx::
    __normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
    ::operator++(&__end1);
  }
  last_flag_expecting_args._7_1_ = 0;
  last_option_expecting_args = (option_result *)0x0;
  pvStack_968 = (reference)0x0;
  arg_i._4_4_ = 0;
  arg_end = argv + 1;
  arg_i_cstr = (char *)(argv + argc);
  do {
    while( true ) {
      while( true ) {
        if (arg_end == (char **)arg_i_cstr) {
          if (arg_i._4_4_ != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1218);
            poVar5 = std::operator<<((ostream *)local_1218,"last option \"");
            poVar5 = std::operator<<(poVar5,(char *)last_option_expecting_args);
            poVar5 = std::operator<<(poVar5,
                                     "\" expects an argument but the parser ran out of command line "
                                    );
            std::operator<<(poVar5,"arguments to parse");
            this_03 = (option_lacks_argument_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            option_lacks_argument_error::runtime_error(this_03,local_1238);
            __cxa_throw(this_03,&option_lacks_argument_error::typeinfo,
                        option_lacks_argument_error::~option_lacks_argument_error);
          }
          std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_8b0);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
          ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
                            *)&pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          parser_map::~parser_map((parser_map *)&options._M_h._M_single_bucket);
          return __return_storage_ptr__;
        }
        arg_i_len = (size_t)*arg_end;
        local_9a8 = strlen((char *)arg_i_len);
        local_1272 = 1;
        if (((last_flag_expecting_args._7_1_ & 1) == 0) && (local_1272 = 1, arg_i._4_4_ == 0)) {
          bVar2 = cmd_line_arg_is_option_flag((char *)arg_i_len);
          local_1272 = bVar2 ^ 0xff;
        }
        if ((local_1272 & 1) == 0) break;
        if (arg_i._4_4_ == 0) {
          iVar3 = strncmp((char *)arg_i_len,"--",2);
          if ((iVar3 == 0) && (local_9a8 == 2)) {
            last_flag_expecting_args._7_1_ = 1;
            arg_end = arg_end + 1;
          }
          else {
            std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                      (&__return_storage_ptr__->pos,(value_type *)&arg_i_len);
            arg_end = arg_end + 1;
          }
        }
        else {
          pvStack_968->arg = (char *)arg_i_len;
          arg_i._4_4_ = arg_i._4_4_ - 1;
          arg_end = arg_end + 1;
        }
      }
      last_option_expecting_args = (option_result *)0x0;
      pvStack_968 = (reference)0x0;
      arg_i._4_4_ = 0;
      if (*(char *)(arg_i_len + 1) != '-') break;
      pcVar4 = strchr((char *)arg_i_len,0x3d);
      sVar1 = arg_i_len;
      if (pcVar4 != (char *)0x0) {
        local_9a8 = (long)pcVar4 - arg_i_len;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9c8,(char *)sVar1,local_9a8,(allocator *)&msg.field_0x177);
      std::allocator<char>::~allocator((allocator<char> *)&msg.field_0x177);
      bVar2 = parser_map::known_long_flag
                        ((parser_map *)&options._M_h._M_single_bucket,(string *)local_9c8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b48);
        poVar5 = std::operator<<((ostream *)local_b48,"found unexpected flag: ");
        std::operator<<(poVar5,local_9c8);
        puVar6 = (unexpected_option_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        unexpected_option_error::runtime_error(puVar6,local_b68);
        __cxa_throw(puVar6,&unexpected_option_error::typeinfo,
                    unexpected_option_error::~unexpected_option_error);
      }
      msg_1._368_8_ =
           parser_map::get_definition_for_long_flag
                     ((parser_map *)&options._M_h._M_single_bucket,(string *)local_9c8);
      if ((pcVar4 != (char *)0x0) && (((definition *)msg_1._368_8_)->num_args == 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cf0);
        poVar5 = std::operator<<((ostream *)local_cf0,
                                 "found argument for option not expecting an argument: ");
        std::operator<<(poVar5,(char *)arg_i_len);
        this_00 = (unexpected_argument_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        unexpected_argument_error::runtime_error(this_00,local_d10);
        __cxa_throw(this_00,&unexpected_argument_error::typeinfo,
                    unexpected_argument_error::~unexpected_argument_error);
      }
      opt_result.arg =
           (char *)std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
                   ::operator[](&__return_storage_ptr__->options,(key_type *)msg_1._368_8_);
      vStack_d28.arg = (char *)0x0;
      std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::push_back
                ((vector<argagg::option_result,_std::allocator<argagg::option_result>_> *)
                 opt_result.arg,&stack0xfffffffffffff2d8);
      bVar2 = definition::requires_arguments((definition *)msg_1._368_8_);
      if (bVar2) {
        if (pcVar4 == (char *)0x0) {
          last_option_expecting_args = (option_result *)arg_i_len;
          pvStack_968 = std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::
                        back((vector<argagg::option_result,_std::allocator<argagg::option_result>_>
                              *)opt_result.arg);
          arg_i._4_4_ = *(uint *)(msg_1._368_8_ + 0x58);
        }
        else {
          pvVar7 = std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::back
                             ((vector<argagg::option_result,_std::allocator<argagg::option_result>_>
                               *)opt_result.arg);
          pvVar7->arg = pcVar4 + 1;
        }
      }
      arg_end = arg_end + 1;
      std::__cxx11::string::~string(local_9c8);
    }
    for (uStack_d38 = 1; uStack_d38 < local_9a8; uStack_d38 = uStack_d38 + 1) {
      msg_2._375_1_ = *(char *)(arg_i_len + uStack_d38);
      iVar3 = isalnum((int)(char)msg_2._375_1_);
      if (iVar3 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_eb8);
        poVar5 = std::operator<<((ostream *)local_eb8,"found non-alphanumeric character \'");
        poVar5 = std::operator<<(poVar5,*(char *)(arg_i_len + uStack_d38));
        poVar5 = std::operator<<(poVar5,"\' in flag group \'");
        poVar5 = std::operator<<(poVar5,(char *)arg_i_len);
        std::operator<<(poVar5,"\'");
        msg_3._375_1_ = 1;
        this_01 = (domain_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::domain_error::domain_error(this_01,local_ed8);
        msg_3._375_1_ = 0;
        __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      bVar2 = parser_map::known_short_flag
                        ((parser_map *)&options._M_h._M_single_bucket,msg_2._375_1_);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1058);
        poVar5 = std::operator<<((ostream *)local_1058,"found unexpected flag \'");
        poVar5 = std::operator<<(poVar5,*(char *)(arg_i_len + uStack_d38));
        poVar5 = std::operator<<(poVar5,"\' in flag group \'");
        poVar5 = std::operator<<(poVar5,(char *)arg_i_len);
        std::operator<<(poVar5,"\'");
        puVar6 = (unexpected_option_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        unexpected_option_error::runtime_error(puVar6,local_1078);
        __cxa_throw(puVar6,&unexpected_option_error::typeinfo,
                    unexpected_option_error::~unexpected_option_error);
      }
      this_02 = parser_map::get_definition_for_short_flag
                          ((parser_map *)&options._M_h._M_single_bucket,msg_2._375_1_);
      opt_result_1.arg =
           (char *)std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
                   ::operator[](&__return_storage_ptr__->options,&this_02->name);
      vStack_1098.arg = (char *)0x0;
      std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::push_back
                ((vector<argagg::option_result,_std::allocator<argagg::option_result>_> *)
                 opt_result_1.arg,&stack0xffffffffffffef68);
      bVar2 = definition::requires_arguments(this_02);
      if (bVar2) {
        msg_4._375_1_ = uStack_d38 == local_9a8 - 1;
        if ((bool)msg_4._375_1_) {
          last_option_expecting_args = (option_result *)arg_i_len;
          pvStack_968 = std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::
                        back((vector<argagg::option_result,_std::allocator<argagg::option_result>_>
                              *)opt_result_1.arg);
          arg_i._4_4_ = this_02->num_args;
        }
        else {
          lVar8 = arg_i_len + uStack_d38;
          pvVar7 = std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::back
                             ((vector<argagg::option_result,_std::allocator<argagg::option_result>_>
                               *)opt_result_1.arg);
          pvVar7->arg = (char *)(lVar8 + 1);
        }
        break;
      }
    }
    arg_end = arg_end + 1;
  } while( true );
}

Assistant:

inline
parser_results parser::parse(int argc, const char** argv) const
{
  // Inspect each definition to see if its valid. You may wonder "why don't
  // you do this validation on construction?" I had thought about it but
  // realized that since I've made the parser an aggregate type (granted it
  // just "aggregates" a single vector) I would need to track any changes to
  // the definitions vector and re-run the validity check in order to
  // maintain this expected "validity invariant" on the object. That would
  // then require hiding the definitions vector as a private entry and then
  // turning the parser into a thin interface (by re-exposing setters and
  // getters) to the vector methods just so that I can catch when the
  // definition has been modified. It seems much simpler to just enforce the
  // validity when you actually want to parse because it's at the moment of
  // parsing that you know the definitions are complete.
  parser_map map = validate_definitions(this->definitions);

  // Initialize the parser results that we'll be returning. Store the program
  // name (assumed to be the first command line argument) and initialize
  // everything else as empty.
  std::unordered_map<std::string, option_results> options {};
  std::vector<const char*> pos;
  parser_results results {argv[0], std::move(options), std::move(pos)};

  // Add an empty option result for each definition.
  for (const auto& defn : this->definitions) {
    option_results opt_results {{}};
    results.options.insert(
      std::make_pair(defn.name, opt_results));
  }

  // Don't start off ignoring flags. We only ignore flags after a -- shows up
  // in the command line arguments.
  bool ignore_flags = false;

  // Keep track of any options that are expecting arguments.
  const char* last_flag_expecting_args = nullptr;
  option_result* last_option_expecting_args = nullptr;
  unsigned int num_option_args_to_consume = 0;

  // Get pointers to pointers so we can treat the raw pointer array as an
  // iterator for standard library algorithms. This isn't used yet but can be
  // used to template this function to work on iterators over strings or
  // C-strings.
  const char** arg_i = argv + 1;
  const char** arg_end = argv + argc;

  while (arg_i != arg_end) {
    auto arg_i_cstr = *arg_i;
    auto arg_i_len = std::strlen(arg_i_cstr);

    // Some behavior to note: if the previous option is expecting an argument
    // then the next entry will be treated as a positional argument even if
    // it looks like a flag.
    bool treat_as_positional_argument = (
        ignore_flags
        || num_option_args_to_consume > 0
        || !cmd_line_arg_is_option_flag(arg_i_cstr)
      );
    if (treat_as_positional_argument) {

      // If last option is expecting some specific positive number of
      // arguments then give this argument to that option, *regardless of
      // whether or not the argument looks like a flag or is the special "--"
      // argument*.
      if (num_option_args_to_consume > 0) {
        last_option_expecting_args->arg = arg_i_cstr;
        --num_option_args_to_consume;
        ++arg_i;
        continue;
      }

      // Now we check if this is just "--" which is a special argument that
      // causes all following arguments to be treated as non-options and is
      // itselve discarded.
      if (std::strncmp(arg_i_cstr, "--", 2) == 0 && arg_i_len == 2) {
        ignore_flags = true;
        ++arg_i;
        continue;
      }

      // If there are no expectations for option arguments then simply use
      // this argument as a positional argument.
      results.pos.push_back(arg_i_cstr);
      ++arg_i;
      continue;
    }

    // Reset the "expecting argument" state.
    last_flag_expecting_args = nullptr;
    last_option_expecting_args = nullptr;
    num_option_args_to_consume = 0;

    // If we're at this point then we're definitely dealing with something
    // that is flag-like and has hyphen as the first character and has a
    // length of at least two characters. How we handle this potential flag
    // depends on whether or not it is a long-option so we check that first.
    bool is_long_flag = (arg_i_cstr[1] == '-');

    if (is_long_flag) {

      // Long flags have a complication: their arguments can be specified
      // using an '=' character right inside the argument. That means an
      // argument like "--output=foobar.txt" is actually an option with flag
      // "--output" and argument "foobar.txt". So we look for the first
      // instance of the '=' character and keep it in long_flag_arg. If
      // long_flag_arg is nullptr then we didn't find '='. We need the
      // flag_len to construct long_flag_str below.
      auto long_flag_arg = std::strchr(arg_i_cstr, '=');
      std::size_t flag_len = arg_i_len;
      if (long_flag_arg != nullptr) {
        flag_len = static_cast<std::size_t>(long_flag_arg - arg_i_cstr);
      }
      std::string long_flag_str(arg_i_cstr, flag_len);

      if (!map.known_long_flag(long_flag_str)) {
        std::ostringstream msg;
        msg << "found unexpected flag: " << long_flag_str;
        throw unexpected_option_error(msg.str());
      }

      const auto defn = map.get_definition_for_long_flag(long_flag_str);

      if (long_flag_arg != nullptr && defn->num_args == 0) {
        std::ostringstream msg;
        msg << "found argument for option not expecting an argument: "
            << arg_i_cstr;
        throw unexpected_argument_error(msg.str());
      }

      // We've got a legitimate, known long flag option so we add an option
      // result. This option result initially has an arg of nullptr, but that
      // might change in the following block.
      auto& opt_results = results.options[defn->name];
      option_result opt_result {nullptr};
      opt_results.all.push_back(std::move(opt_result));

      if (defn->requires_arguments()) {
        bool there_is_an_equal_delimited_arg = (long_flag_arg != nullptr);
        if (there_is_an_equal_delimited_arg) {
          // long_flag_arg would be "=foo" in the "--output=foo" case so we
          // increment by 1 to get rid of the equal sign.
          opt_results.all.back().arg = long_flag_arg + 1;
        } else {
          last_flag_expecting_args = arg_i_cstr;
          last_option_expecting_args = &(opt_results.all.back());
          num_option_args_to_consume = defn->num_args;
        }
      }

      ++arg_i;
      continue;
    }

    // If we've made it here then we're looking at either a short flag or a
    // group of short flags. Short flags can be grouped together so long as
    // they don't require any arguments unless the option that does is the
    // last in the group ("-o x -v" is okay, "-vo x" is okay, "-ov x" is
    // not). So starting after the dash we're going to process each character
    // as if it were a separate flag. Note "sf_idx" stands for "short flag
    // index".
    for (std::size_t sf_idx = 1; sf_idx < arg_i_len; ++sf_idx) {
      const auto short_flag = arg_i_cstr[sf_idx];

      if (!std::isalnum(short_flag)) {
        std::ostringstream msg;
        msg << "found non-alphanumeric character '" << arg_i_cstr[sf_idx]
            << "' in flag group '" << arg_i_cstr << "'";
        throw std::domain_error(msg.str());
      }

      if (!map.known_short_flag(short_flag)) {
        std::ostringstream msg;
        msg << "found unexpected flag '" << arg_i_cstr[sf_idx]
            << "' in flag group '" << arg_i_cstr << "'";
        throw unexpected_option_error(msg.str());
      }

      auto defn = map.get_definition_for_short_flag(short_flag);
      auto& opt_results = results.options[defn->name];

      // Create an option result with an empty argument (for now) and add it
      // to this option's results.
      option_result opt_result {nullptr};
      opt_results.all.push_back(std::move(opt_result));

      if (defn->requires_arguments()) {

        // If this short flag's option requires an argument and we're the
        // last flag in the short flag group then just put the parser into
        // "expecting argument for last option" state and move onto the next
        // command line argument.
        bool is_last_short_flag_in_group = (sf_idx == arg_i_len - 1);
        if (is_last_short_flag_in_group) {
          last_flag_expecting_args = arg_i_cstr;
          last_option_expecting_args = &(opt_results.all.back());
          num_option_args_to_consume = defn->num_args;
          break;
        }

        // If this short flag's option requires an argument and we're NOT the
        // last flag in the short flag group then we automatically consume
        // the rest of the short flag group as the argument for this flag.
        // This is how we get the POSIX behavior of being able to specify a
        // flag's arguments without a white space delimiter (e.g.
        // "-I/usr/local/include").
        opt_results.all.back().arg = arg_i_cstr + sf_idx + 1;
        break;
      }
    }

    ++arg_i;
    continue;
  }

  // If we're done with all of the arguments but are still expecting
  // arguments for a previous option then we haven't satisfied that option.
  // This is an error.
  if (num_option_args_to_consume > 0) {
    std::ostringstream msg;
    msg << "last option \"" << last_flag_expecting_args
        << "\" expects an argument but the parser ran out of command line "
        << "arguments to parse";
    throw option_lacks_argument_error(msg.str());
  }

  return results;
}